

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O0

size_t __thiscall
jessilib::find<char,false>
          (jessilib *this,basic_string_view<char,_std::char_traits<char>_> in_string,
          char32_t in_codepoint)

{
  basic_string_view<char,_std::char_traits<char>_> in_string_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  size_type __n;
  decode_result dVar4;
  decode_result string_front;
  basic_string_view<char,_std::char_traits<char>_> string;
  size_t codepoints_removed;
  undefined1 auStack_20 [4];
  char32_t in_codepoint_local;
  basic_string_view<char,_std::char_traits<char>_> in_string_local;
  
  in_string_local._M_len = in_string._M_len;
  _auStack_20 = this;
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20);
  if (!bVar1) {
    iVar2 = jessilib::fold((wchar32)in_string._M_str);
    string._M_str = (char *)0x0;
    while (bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                             ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      in_string_00._M_str = (char *)in_string_local._M_len;
      in_string_00._M_len = (size_t)_auStack_20;
      dVar4 = decode_codepoint<char>(in_string_00);
      __n = dVar4.units;
      if (__n == 0) {
        return 0xffffffffffffffff;
      }
      iVar3 = jessilib::fold(dVar4.codepoint);
      if (iVar3 == iVar2) {
        return (size_t)string._M_str;
      }
      std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20,__n);
      string._M_str = string._M_str + __n;
    }
  }
  return 0xffffffffffffffff;
}

Assistant:

size_t find(std::basic_string_view<LhsCharT> in_string, char32_t in_codepoint) {
	// If we don't have anything to search through, there's nothing to be found
	if (in_string.empty()) {
		return decltype(in_string)::npos;
	}

	if constexpr (!CaseSensitive) {
		in_codepoint = fold(in_codepoint);
	}

	size_t codepoints_removed{};
	while (!in_string.empty()) {
		std::basic_string_view<LhsCharT> string = in_string;
		decode_result string_front = decode_codepoint(string);

		if (string_front.units == 0) {
			// Failed to decode front codepoint; bad unicode sequence
			return decltype(in_string)::npos;
		}

		if constexpr (CaseSensitive) {
			if (string_front.codepoint == in_codepoint) {
				// Match found!
				return codepoints_removed;
			}
		}
		else {
			if (fold(string_front.codepoint) == in_codepoint) {
				// Match found!
				return codepoints_removed;
			}
		}

		// Didn't find a match here; remove the front codepoint and try the next position
		in_string.remove_prefix(string_front.units);
		codepoints_removed += string_front.units;
	}

	// We reached the end of in_string before finding the prefix :(
	return decltype(in_string)::npos;
}